

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O2

void do_ban(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  BUFFER *buffer;
  CRow *pCVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  tm *__tp;
  undefined8 uVar11;
  undefined8 uVar12;
  CRow row;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char arg4 [4608];
  char buf [4608];
  
  pcVar4 = one_argument(argument,arg1);
  pcVar4 = one_argument(pcVar4,arg2);
  pcVar4 = one_argument(pcVar4,arg3);
  pcVar4 = one_argument(pcVar4,arg4);
  if (arg1[0] == '\0') {
    bVar1 = true;
  }
  else {
    bVar1 = str_prefix(arg1,"show");
    if (!bVar1) {
      iVar3 = CSQLInterface::Select
                        (&RS.SQL,
                         "bans.*,DATE_FORMAT(date,\'%%m/%%d/%%Y\') FROM bans ORDER BY duration DESC"
                        );
      if (iVar3 != 0) {
        buffer = new_buf();
        sprintf(buf,"%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r","Site","By","Type","Date",
                "Duration","Reason");
        while( true ) {
          add_buf(buffer,buf);
          bVar1 = CSQLInterface::End(&RS.SQL);
          if (bVar1) break;
          pCVar5 = CSQLInterface::GetRow(&RS.SQL);
          row.maxcol = pCVar5->maxcol;
          row.maxrow = pCVar5->maxrow;
          row.rowpos = pCVar5->rowpos;
          row.row = pCVar5->row;
          pcVar4 = CRow::operator[](&row,0);
          pcVar6 = CRow::operator[](&row,1);
          pcVar7 = CRow::operator[](&row,5);
          iVar3 = atoi(pcVar7);
          pcVar7 = "All";
          if (0 < iVar3) {
            pcVar7 = "Newbie";
          }
          pcVar8 = CRow::operator[](&row,7);
          pcVar9 = CRow::operator[](&row,4);
          pcVar10 = CRow::operator[](&row,2);
          sprintf(buf,"%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r",pcVar4,pcVar6,pcVar7,pcVar8,
                  pcVar9,pcVar10);
        }
        pcVar4 = buf_string(buffer);
        page_to_char(pcVar4,ch);
        free_buf(buffer);
        return;
      }
      pcVar4 = "There are no current bans placed.\n\r";
      goto LAB_002d1dff;
    }
    bVar1 = arg1[0] == '\0';
  }
  if ((((bVar1) || (arg2[0] == '\0')) || (arg3[0] == '\0')) || (arg4[0] == '\0')) {
    do_ban(ch,"show");
    pcVar4 = 
    "Syntax:    ban <site> <ip/host> <newbie/all> <duration> <reason>    (-1 duration is permanent)\n\r           unban <site>\n\r           ban show\n\r"
    ;
  }
  else {
    bVar1 = str_prefix(arg2,"ip");
    if (bVar1) {
      bVar1 = str_prefix(arg2,"host");
      uVar11 = 0;
      if (bVar1) goto LAB_002d1d52;
    }
    else {
      uVar11 = 1;
    }
    bVar1 = str_prefix(arg3,"all");
    uVar12 = 0;
    if (bVar1) {
      bVar1 = str_prefix(arg3,"newbie");
      if (bVar1) {
LAB_002d1d52:
        do_ban(ch,"");
        return;
      }
      uVar12 = 1;
    }
    uVar2 = atoi(arg4);
    __tp = localtime(&current_time);
    strftime(buf,200,"%Y-%m-%d",__tp);
    iVar3 = CSQLInterface::Insert
                      (&RS.SQL,"bans VALUES(\'%s\',\'%s\',\'%s\',\'%s\',%d,%d,%d)",arg1,
                       ch->true_name,pcVar4,buf,(ulong)uVar2,uVar12,uVar11);
    if (iVar3 == 0) {
      pcVar4 = "Ban failed, error..yell at Morglum.\n\r";
    }
    else {
      pcVar4 = "Ban added.\n\r";
    }
  }
LAB_002d1dff:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_ban(CHAR_DATA *ch, char *argument)
{
	//TODO: This is function really needs to be two functions. One to perform bans and the other to list bans.

	char buf[MSL];
	char arg1[MSL], arg2[MSL], arg3[MSL], arg4[MSL], date[MSL];
	BUFFER *buffer;
	int ban_type = 0, host_type = 0, res, duration = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);
	argument = one_argument(argument, arg4);

	if (arg1[0] != '\0' && !str_prefix(arg1, "show"))
	{
		res = RS.SQL.Select("bans.*,DATE_FORMAT(date,\'%%m/%%d/%%Y\') FROM bans ORDER BY duration DESC");

		if (res)
		{
			buffer = new_buf();

			sprintf(buf, "%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r", "Site", "By", "Type", "Date", "Duration", "Reason");
			add_buf(buffer, buf);

			while (!RS.SQL.End())
			{
				auto row = RS.SQL.GetRow();

				sprintf(buf, "%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r",
					row[0],
					row[1],
					(atoi(row[5]) > 0) ? "Newbie" : "All",
					row[7],
					row[4],
					row[2]);

				add_buf(buffer, buf);
			}

			page_to_char(buf_string(buffer), ch);
			free_buf(buffer);
		}
		else
		{
			send_to_char("There are no current bans placed.\n\r", ch);
		}

		return;
	}

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0' || arg4[0] == '\0')
	{
		do_ban(ch, "show");
		send_to_char("Syntax:    ban <site> <ip/host> <newbie/all> <duration> <reason>    (-1 duration is permanent)\n\r           unban <site>\n\r           ban show\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "ip"))
	{
		host_type = NBAN_IP;
	}
	else if (!str_prefix(arg2, "host"))
	{
		host_type = NBAN_HOST;
	}
	else
	{
		do_ban(ch, "");
		return;
	}

	if (!str_prefix(arg3, "all"))
	{
		ban_type = NBAN_ALL;
	}
	else if (!str_prefix(arg3, "newbie"))
	{
		ban_type = NBAN_NEWBIE;
	}
	else
	{
		do_ban(ch, "");
		return;
	}

	duration = atoi(arg4);

	strftime(date, 200, "%Y-%m-%d", localtime(&current_time));

	res = RS.SQL.Insert("bans VALUES(\'%s\',\'%s\',\'%s\',\'%s\',%d,%d,%d)", arg1, ch->true_name, argument, date, duration, ban_type, host_type);
	if (res)
	{
		send_to_char("Ban added.\n\r", ch);
		return;
	}
	else
	{
		send_to_char("Ban failed, error..yell at Morglum.\n\r", ch);
		return;
	}
}